

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promises.cpp
# Opt level: O2

shared_ptr<SchemeObject> make_promise(shared_ptr<ASTNode> *body,Context *context)

{
  _Alloc_hider _Var1;
  Context *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SchemeObject> sVar2;
  shared_ptr<SchemeCompoundProcedure> f;
  long local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  _Alloc_hider _Stack_60;
  undefined1 local_28 [8];
  
  std::make_shared<SchemeCompoundProcedure>();
  Context::operator=((Context *)(local_78 + 0x68),in_RDX);
  ASTNode::ASTNode((ASTNode *)&local_68,
                   (ASTNode *)
                   (context->locals).
                   super__List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next);
  std::__cxx11::list<ASTNode,std::allocator<ASTNode>>::_M_assign_dispatch<ASTNode_const*>
            ((list<ASTNode,std::allocator<ASTNode>> *)(local_78 + 0x50),(ASTNode *)&local_68,
             local_28);
  ASTNode::~ASTNode((ASTNode *)&local_68);
  std::make_shared<SchemePromise,std::shared_ptr<SchemeCompoundProcedure>&>
            ((shared_ptr<SchemeCompoundProcedure> *)&local_68);
  _Var1._M_p = _Stack_60._M_p;
  _Stack_60._M_p = (pointer)0x0;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_68;
  (body->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_p;
  local_68 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)body;
  return (shared_ptr<SchemeObject>)
         sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<SchemeObject> make_promise(std::shared_ptr<ASTNode> body, const Context &context)
{
    auto f = std::make_shared<SchemeCompoundProcedure>();
    f->context = context;
    f->body = {*body};
    return std::make_shared<SchemePromise>(f);
}